

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O1

Image<float,_gimage::PixelTraits<float>_> *
gimage::operator-=(Image<float,_gimage::PixelTraits<float>_> *image,work_t s)

{
  int iVar1;
  float fVar2;
  long lVar3;
  long lVar4;
  float ***pppfVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  iVar1 = image->depth;
  if (0 < (long)iVar1) {
    lVar3 = image->width;
    lVar4 = image->height;
    lVar7 = 0;
    do {
      if (0 < lVar4) {
        pppfVar5 = image->img;
        lVar8 = 0;
        do {
          if (0 < lVar3) {
            pfVar6 = pppfVar5[lVar7][lVar8];
            lVar9 = 0;
            do {
              fVar2 = pfVar6[lVar9];
              if ((uint)ABS(fVar2) < 0x7f800000) {
                pfVar6[lVar9] = fVar2 - s;
              }
              lVar9 = lVar9 + 1;
            } while (lVar3 != lVar9);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != lVar4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return image;
}

Assistant:

Image<T> &operator-=(Image<T> &image, typename Image<T>::work_t s)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        T v=0;

        v=image.get(i, k, d);

        if (image.isValidS(v))
        {
          image.setLimited(i, k, d, v-s);
        }
      }
    }
  }

  return image;
}